

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

int __thiscall
baryonyx::itm::compute_order::
infeasibility_local_compute_violated_constraints<baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>const,baryonyx::bit_array>
          (compute_order *this,
          solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
          *solver,bit_array *x)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  bool bVar4;
  ulong uVar5;
  undefined8 uVar6;
  pointer ppVar7;
  uint uVar8;
  _Head_base<0UL,_int_*,_false> _Var9;
  pointer ppVar10;
  ulong uVar11;
  ulong uVar12;
  sparse_matrix<int> *psVar13;
  undefined1 auVar14 [16];
  undefined1 auVar16 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  int iVar23;
  undefined1 auVar24 [64];
  _Head_base<0UL,_int_*,_false> local_50;
  _Head_base<0UL,_int_*,_false> local_48;
  _Head_base<0UL,_int_*,_false> local_40;
  bit_array *local_38;
  undefined1 auVar15 [32];
  undefined1 auVar17 [32];
  
  ppVar7 = (this->m_order).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_order).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar7) {
    (this->m_order).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppVar7;
  }
  uVar1 = solver->m;
  ppVar10 = ppVar7;
  if ((ulong)uVar1 != 0) {
    uVar11 = 0;
    local_40._M_head_impl = (int *)this;
    local_38 = x;
    do {
      psVar13 = (sparse_matrix<int> *)&local_50;
      sparse_matrix<int>::row((sparse_matrix<int> *)&local_50,(int)solver + 0x10);
      auVar18 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      vpmovsxbd_avx2(ZEXT816(0x3830282018100800));
      auVar17._8_4_ = 0xffffffc0;
      auVar17._0_8_ = 0xffffffc0ffffffc0;
      auVar17._12_4_ = 0xffffffc0;
      auVar17._16_4_ = 0xffffffc0;
      auVar17._20_4_ = 0xffffffc0;
      auVar17._24_4_ = 0xffffffc0;
      auVar17._28_4_ = 0xffffffc0;
      auVar19 = vpbroadcastq_avx512f(ZEXT816(1));
      iVar23 = 0;
      if (local_48._M_head_impl != local_50._M_head_impl) {
        uVar12 = 0;
        auVar20 = vpbroadcastq_avx512f();
        auVar21 = vpsrlq_avx512f(auVar20,3);
        _Var9._M_head_impl = local_48._M_head_impl;
        auVar20 = ZEXT1664((undefined1  [16])0x0);
        do {
          auVar24 = auVar20;
          auVar20 = vpbroadcastq_avx512f();
          uVar12 = uVar12 + 8;
          auVar20 = vporq_avx512f(auVar20,auVar18);
          uVar5 = vpcmpuq_avx512f(auVar20,auVar21,2);
          auVar15 = vpgatherdd_avx512vl(*(undefined4 *)
                                         ((long)(_Var9._M_head_impl + 1) + (long)psVar13));
          bVar3 = (byte)uVar5;
          auVar16._4_4_ = (uint)((byte)(uVar5 >> 1) & 1) * auVar15._4_4_;
          auVar16._0_4_ = (uint)(bVar3 & 1) * auVar15._0_4_;
          auVar16._8_4_ = (uint)((byte)(uVar5 >> 2) & 1) * auVar15._8_4_;
          auVar16._12_4_ = (uint)((byte)(uVar5 >> 3) & 1) * auVar15._12_4_;
          auVar16._16_4_ = (uint)((byte)(uVar5 >> 4) & 1) * auVar15._16_4_;
          auVar16._20_4_ = (uint)((byte)(uVar5 >> 5) & 1) * auVar15._20_4_;
          auVar16._24_4_ = (uint)((byte)(uVar5 >> 6) & 1) * auVar15._24_4_;
          auVar16._28_4_ = (uint)(byte)(uVar5 >> 7) * auVar15._28_4_;
          _Var9._M_head_impl = _Var9._M_head_impl + 0x10;
          auVar15 = vpsrad_avx2(auVar16,0x1f);
          auVar15 = vpsrld_avx2(auVar15,0x1a);
          auVar15 = vpaddd_avx2(auVar16,auVar15);
          vpsrad_avx2(auVar15,6);
          auVar15 = vpand_avx2(auVar17,auVar15);
          auVar15 = vpsubd_avx2(auVar16,auVar15);
          auVar20 = vpgatherdq_avx512f((int)*(local_38->super_bit_array_impl).m_data._M_t.
                                             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                             .super__Head_base<0UL,_unsigned_long_*,_false>.
                                             _M_head_impl);
          auVar22._8_8_ = (ulong)((byte)(uVar5 >> 1) & 1) * auVar20._8_8_;
          auVar22._0_8_ = (ulong)(bVar3 & 1) * auVar20._0_8_;
          auVar22._16_8_ = (ulong)((byte)(uVar5 >> 2) & 1) * auVar20._16_8_;
          auVar22._24_8_ = (ulong)((byte)(uVar5 >> 3) & 1) * auVar20._24_8_;
          auVar22._32_8_ = (ulong)((byte)(uVar5 >> 4) & 1) * auVar20._32_8_;
          auVar22._40_8_ = (ulong)((byte)(uVar5 >> 5) & 1) * auVar20._40_8_;
          auVar22._48_8_ = (ulong)((byte)(uVar5 >> 6) & 1) * auVar20._48_8_;
          auVar22._56_8_ = (uVar5 >> 7) * auVar20._56_8_;
          auVar20 = vpmovzxdq_avx512f(auVar15);
          auVar20 = vpsrlvq_avx512f(auVar22,auVar20);
          uVar6 = vptestmq_avx512f(auVar20,auVar19);
          auVar15 = vpmovm2d_avx512vl(uVar6);
          auVar15 = vpsubd_avx2(auVar24._0_32_,auVar15);
          auVar20 = ZEXT3264(auVar15);
        } while (((((long)local_50._M_head_impl - (long)local_48._M_head_impl) - 8U >> 3) + 8 &
                 0xfffffffffffffff8) != uVar12);
        auVar17 = vmovdqa32_avx512vl(auVar15);
        auVar14._0_4_ = (uint)(bVar3 & 1) * auVar17._0_4_ | (uint)!(bool)(bVar3 & 1) * auVar24._0_4_
        ;
        bVar4 = (bool)((byte)(uVar5 >> 1) & 1);
        auVar14._4_4_ = (uint)bVar4 * auVar17._4_4_ | (uint)!bVar4 * auVar24._4_4_;
        bVar4 = (bool)((byte)(uVar5 >> 2) & 1);
        auVar14._8_4_ = (uint)bVar4 * auVar17._8_4_ | (uint)!bVar4 * auVar24._8_4_;
        bVar4 = (bool)((byte)(uVar5 >> 3) & 1);
        auVar14._12_4_ = (uint)bVar4 * auVar17._12_4_ | (uint)!bVar4 * auVar24._12_4_;
        bVar4 = (bool)((byte)(uVar5 >> 4) & 1);
        auVar15._16_4_ = (uint)bVar4 * auVar17._16_4_ | (uint)!bVar4 * auVar24._16_4_;
        auVar15._0_16_ = auVar14;
        bVar4 = (bool)((byte)(uVar5 >> 5) & 1);
        auVar15._20_4_ = (uint)bVar4 * auVar17._20_4_ | (uint)!bVar4 * auVar24._20_4_;
        bVar4 = (bool)((byte)(uVar5 >> 6) & 1);
        auVar15._24_4_ = (uint)bVar4 * auVar17._24_4_ | (uint)!bVar4 * auVar24._24_4_;
        bVar4 = SUB81(uVar5 >> 7,0);
        auVar15._28_4_ = (uint)bVar4 * auVar17._28_4_ | (uint)!bVar4 * auVar24._28_4_;
        auVar14 = vphaddd_avx(auVar15._16_16_,auVar14);
        auVar14 = vphaddd_avx(auVar14,auVar14);
        auVar14 = vphaddd_avx(auVar14,auVar14);
        iVar23 = auVar14._0_4_;
      }
      iVar2 = (solver->b)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
              super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
              super__Head_base<0UL,_int_*,_false>._M_head_impl[uVar11];
      uVar8 = iVar2 - iVar23;
      if (uVar8 == 0 || iVar2 < iVar23) {
        if (iVar2 < iVar23) {
          uVar8 = iVar23 - iVar2;
          goto LAB_0023ae9b;
        }
      }
      else {
LAB_0023ae9b:
        local_50._M_head_impl = (int *)((ulong)uVar8 << 0x20 | uVar11);
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        emplace_back<std::pair<int,int>>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&this->m_order,
                   (pair<int,_int> *)&local_50);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar1);
    ppVar10 = (((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               ((long)local_40._M_head_impl + 0x18))->
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    ppVar7 = *(pointer *)((long)local_40._M_head_impl + 0x20);
  }
  return (int)((ulong)((long)ppVar7 - (long)ppVar10) >> 3);
}

Assistant:

int infeasibility_local_compute_violated_constraints(Solver& solver,
                                                         const Xtype& x)
    {
        m_order.clear();

        for (int k = 0, e = solver.m; k != e; ++k) {
            sparse_matrix<int>::const_row_iterator it, et;
            std::tie(it, et) = solver.ap.row(k);
            int v = 0;

            for (; it != et; ++it)
                v += solver.factor(it->value) * x[it->column];

            if (solver.bound_min(k) > v)
                m_order.push_back(std::make_pair(k, solver.bound_min(k) - v));
            else if (solver.bound_max(k) < v)
                m_order.push_back(std::make_pair(k, v - solver.bound_max(k)));
        }

        return length(m_order);
    }